

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitStringTest_random_long_trailing_two_delim_Test<char32_t>::
SplitStringTest_random_long_trailing_two_delim_Test
          (SplitStringTest_random_long_trailing_two_delim_Test<char32_t> *this)

{
  SplitStringTest_random_long_trailing_two_delim_Test<char32_t> *this_local;
  
  SplitStringTest<char32_t>::SplitStringTest(&this->super_SplitStringTest<char32_t>);
  *(undefined ***)&this->super_SplitStringTest<char32_t> =
       &PTR__SplitStringTest_random_long_trailing_two_delim_Test_0081f700;
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, random_long_trailing_two_delim) {
	auto delim = make_delim_long<TypeParam>(8);
	RandomTestData<TypeParam> data{ delim };
	data.m_str += delim + delim;
	data.m_tokens.emplace_back();
	data.m_tokens.emplace_back();
	std::vector<std::basic_string<TypeParam>> split_result = split(data.m_str, delim);
	EXPECT_EQ(split_result, data.m_tokens);
}